

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dgstrs.c
# Opt level: O2

void dgstrs(trans_t trans,SuperMatrix *L,SuperMatrix *U,int *perm_c,int *perm_r,SuperMatrix *B,
           SuperLUStat_t *stat,int *info)

{
  uint uVar1;
  int iVar2;
  uint *puVar3;
  double *pdVar4;
  void *pvVar5;
  long lVar6;
  void *pvVar7;
  long lVar8;
  double *Mxvec;
  double *addr;
  ulong uVar9;
  double *pdVar10;
  ulong uVar11;
  long lVar12;
  int iVar13;
  ulong uVar14;
  ulong n;
  ulong uVar15;
  int iVar16;
  int iVar17;
  ulong uVar18;
  long lVar19;
  long lVar20;
  uint uVar21;
  long lVar22;
  long lVar23;
  bool bVar24;
  float fVar25;
  long local_160;
  int ii;
  
  *info = 0;
  if (trans < (CONJ|TRANS)) {
    uVar1 = L->nrow;
    n = (ulong)uVar1;
    ii = 2;
    iVar17 = -2;
    if ((((-1 < (int)uVar1) && (uVar1 == L->ncol)) && (L->Stype == SLU_SC)) &&
       ((L->Dtype == SLU_D && (L->Mtype == SLU_TRLU)))) {
      ii = 3;
      iVar17 = -3;
      if (((-1 < U->nrow) && ((U->nrow == U->ncol && (U->Stype == SLU_NC)))) &&
         ((U->Dtype == SLU_D && (U->Mtype == SLU_TRU)))) {
        puVar3 = (uint *)B->Store;
        uVar21 = *puVar3;
        uVar18 = (ulong)uVar21;
        ii = 6;
        iVar17 = -6;
        if (((((int)uVar1 <= (int)uVar21) && (B->Stype == SLU_DN)) && (B->Dtype == SLU_D)) &&
           (B->Mtype == SLU_GE)) {
          uVar1 = B->ncol;
          Mxvec = doubleCalloc(n * (long)(int)uVar1);
          if (Mxvec == (double *)0x0) {
            sprintf((char *)&ii,"%s at line %d in file %s\n","Malloc fails for local work[].",0x8c,
                    "/workspace/llm4binary/github/license_c_cmakelists/xiaoyeli[P]superlu/SRC/dgstrs.c"
                   );
            superlu_abort_and_exit((char *)&ii);
          }
          addr = doubleMalloc(n);
          if (addr != (double *)0x0) {
            pdVar4 = *(double **)(puVar3 + 2);
            uVar15 = 0;
            if (0 < (int)uVar1) {
              uVar15 = (ulong)uVar1;
            }
            if (trans == NOTRANS) {
              pvVar5 = L->Store;
              lVar6 = *(long *)((long)pvVar5 + 8);
              pvVar7 = U->Store;
              lVar8 = *(long *)((long)pvVar7 + 8);
              pdVar10 = pdVar4;
              for (uVar9 = 0; uVar9 != uVar15; uVar9 = uVar9 + 1) {
                for (uVar14 = 0; n != uVar14; uVar14 = uVar14 + 1) {
                  addr[perm_r[uVar14]] = pdVar10[uVar14];
                }
                for (uVar14 = 0; n != uVar14; uVar14 = uVar14 + 1) {
                  pdVar10[uVar14] = addr[uVar14];
                }
                pdVar10 = pdVar10 + uVar18;
              }
              fVar25 = 0.0;
              local_160 = 0;
              while (uVar9 = (ulong)*(int *)((long)pvVar5 + 4), local_160 <= (long)uVar9) {
                lVar23 = (long)*(int *)(*(long *)((long)pvVar5 + 0x30) + local_160 * 4);
                iVar17 = *(int *)(*(long *)((long)pvVar5 + 0x20) + lVar23 * 4);
                iVar2 = *(int *)(*(long *)((long)pvVar5 + 0x20) + 4 + lVar23 * 4);
                iVar16 = iVar2 - iVar17;
                lVar20 = *(int *)(*(long *)((long)pvVar5 + 0x30) + 4 + local_160 * 4) - lVar23;
                iVar13 = (int)lVar20;
                uVar21 = iVar16 - iVar13;
                local_160 = local_160 + 1;
                fVar25 = (float)(int)(uVar1 * 2 * iVar13 * uVar21) +
                         fVar25 + (float)(int)(uVar1 * iVar13 * (iVar13 + -1));
                if (iVar13 == 1) {
                  for (uVar9 = 0; uVar9 != uVar15; uVar9 = uVar9 + 1) {
                    lVar19 = uVar9 * uVar18;
                    pdVar10 = (double *)
                              (lVar6 + 8 +
                              (long)*(int *)(*(long *)((long)pvVar5 + 0x10) + lVar23 * 4) * 8);
                    lVar20 = (long)iVar17;
                    while (lVar20 = lVar20 + 1, lVar20 < iVar2) {
                      lVar22 = (long)*(int *)(*(long *)((long)pvVar5 + 0x18) + lVar20 * 4);
                      pdVar4[lVar19 + lVar22] =
                           pdVar4[lVar19 + lVar22] - pdVar4[lVar19 + lVar23] * *pdVar10;
                      pdVar10 = pdVar10 + 1;
                    }
                  }
                }
                else {
                  lVar19 = (long)*(int *)(*(long *)((long)pvVar5 + 0x10) + lVar23 * 4);
                  uVar9 = 0;
                  if (0 < (int)uVar21) {
                    uVar9 = (ulong)uVar21;
                  }
                  for (uVar14 = 0; uVar14 != uVar15; uVar14 = uVar14 + 1) {
                    lVar22 = uVar14 * uVar18;
                    dlsolve(iVar16,iVar13,(double *)(lVar6 + lVar19 * 8),pdVar4 + lVar22 + lVar23);
                    dmatvec(iVar16,uVar21,iVar13,(double *)(lVar6 + (lVar20 + lVar19) * 8),
                            pdVar4 + lVar22 + lVar23,Mxvec);
                    for (uVar11 = 0; uVar9 != uVar11; uVar11 = uVar11 + 1) {
                      lVar12 = (long)*(int *)(*(long *)((long)pvVar5 + 0x18) +
                                              (long)(iVar17 + iVar13) * 4 + uVar11 * 4);
                      pdVar4[lVar22 + lVar12] = pdVar4[lVar22 + lVar12] - Mxvec[uVar11];
                      Mxvec[uVar11] = 0.0;
                    }
                  }
                }
              }
              for (; -1 < (int)uVar9; uVar9 = (ulong)((int)uVar9 - 1)) {
                iVar17 = *(int *)(*(long *)((long)pvVar5 + 0x30) + (uVar9 & 0xffffffff) * 4);
                lVar23 = (long)iVar17;
                iVar2 = *(int *)(*(long *)((long)pvVar5 + 0x30) + 4 + (uVar9 & 0xffffffff) * 4);
                iVar17 = iVar2 - iVar17;
                lVar20 = (long)*(int *)(*(long *)((long)pvVar5 + 0x10) + lVar23 * 4);
                if (iVar17 == 1) {
                  pdVar10 = pdVar4 + lVar23;
                  uVar14 = uVar15;
                  while (iVar13 = (int)uVar14, uVar14 = (ulong)(iVar13 - 1), iVar13 != 0) {
                    *pdVar10 = *pdVar10 / *(double *)(lVar6 + lVar20 * 8);
                    pdVar10 = pdVar10 + uVar18;
                  }
                }
                else {
                  iVar13 = *(int *)(*(long *)((long)pvVar5 + 0x20) + 4 + lVar23 * 4);
                  iVar16 = *(int *)(*(long *)((long)pvVar5 + 0x20) + lVar23 * 4);
                  pdVar10 = pdVar4 + lVar23;
                  uVar14 = uVar15;
                  while (bVar24 = uVar14 != 0, uVar14 = uVar14 - 1, bVar24) {
                    dusolve(iVar13 - iVar16,iVar17,(double *)(lVar6 + lVar20 * 8),pdVar10);
                    pdVar10 = pdVar10 + uVar18;
                  }
                }
                fVar25 = fVar25 + (float)(int)(uVar1 * iVar17 * (iVar17 + 1));
                for (uVar14 = 0; uVar14 != uVar15; uVar14 = uVar14 + 1) {
                  lVar19 = uVar14 * uVar18;
                  lVar20 = lVar23;
                  while (lVar20 < iVar2) {
                    iVar17 = *(int *)(*(long *)((long)pvVar7 + 0x18) + 4 + lVar20 * 4);
                    iVar13 = *(int *)(*(long *)((long)pvVar7 + 0x18) + lVar20 * 4);
                    for (lVar22 = (long)iVar13; lVar22 < iVar17; lVar22 = lVar22 + 1) {
                      lVar12 = (long)*(int *)(*(long *)((long)pvVar7 + 0x10) + lVar22 * 4);
                      pdVar4[lVar19 + lVar12] =
                           pdVar4[lVar19 + lVar12] -
                           pdVar4[lVar19 + lVar20] * *(double *)(lVar8 + lVar22 * 8);
                    }
                    fVar25 = fVar25 + (float)((iVar17 - iVar13) * 2);
                    lVar20 = lVar20 + 1;
                  }
                }
              }
              pdVar10 = pdVar4;
              for (uVar9 = 0; uVar9 != uVar15; uVar9 = uVar9 + 1) {
                for (uVar14 = 0; n != uVar14; uVar14 = uVar14 + 1) {
                  addr[uVar14] = pdVar4[uVar9 * uVar18 + (long)perm_c[uVar14]];
                }
                for (uVar14 = 0; n != uVar14; uVar14 = uVar14 + 1) {
                  pdVar10[uVar14] = addr[uVar14];
                }
                pdVar10 = pdVar10 + uVar18;
              }
              stat->ops[0x11] = fVar25;
            }
            else {
              pdVar10 = pdVar4;
              for (uVar9 = 0; uVar9 != uVar15; uVar9 = uVar9 + 1) {
                for (uVar14 = 0; n != uVar14; uVar14 = uVar14 + 1) {
                  addr[perm_c[uVar14]] = pdVar10[uVar14];
                }
                for (uVar14 = 0; n != uVar14; uVar14 = uVar14 + 1) {
                  pdVar10[uVar14] = addr[uVar14];
                }
                pdVar10 = pdVar10 + uVar18;
              }
              stat->ops[0x11] = 0.0;
              pdVar10 = pdVar4;
              uVar9 = uVar15;
              while (bVar24 = uVar9 != 0, uVar9 = uVar9 - 1, bVar24) {
                sp_dtrsv("U","T","N",L,U,pdVar10,stat,info);
                sp_dtrsv("L","T","U",L,U,pdVar10,stat,info);
                pdVar10 = pdVar10 + uVar18;
              }
              pdVar10 = pdVar4;
              for (uVar9 = 0; uVar9 != uVar15; uVar9 = uVar9 + 1) {
                for (uVar14 = 0; n != uVar14; uVar14 = uVar14 + 1) {
                  addr[uVar14] = pdVar4[uVar9 * uVar18 + (long)perm_r[uVar14]];
                }
                for (uVar14 = 0; n != uVar14; uVar14 = uVar14 + 1) {
                  pdVar10[uVar14] = addr[uVar14];
                }
                pdVar10 = pdVar10 + uVar18;
              }
            }
            superlu_free(Mxvec);
            superlu_free(addr);
            return;
          }
          sprintf((char *)&ii,"%s at line %d in file %s\n","Malloc fails for local soln[].",0x8e,
                  "/workspace/llm4binary/github/license_c_cmakelists/xiaoyeli[P]superlu/SRC/dgstrs.c"
                 );
          superlu_abort_and_exit((char *)&ii);
        }
      }
    }
  }
  else {
    ii = 1;
    iVar17 = -1;
  }
  *info = iVar17;
  input_error("dgstrs",&ii);
  return;
}

Assistant:

void
dgstrs (trans_t trans, SuperMatrix *L, SuperMatrix *U,
        const int *perm_c, const int *perm_r, SuperMatrix *B,
        SuperLUStat_t *stat, int *info)
{

#ifdef _CRAY
    _fcd ftcs1, ftcs2, ftcs3, ftcs4;
#endif
#ifdef USE_VENDOR_BLAS
    double   alpha = 1.0, beta = 1.0;
    double   *work_col;
#endif
    DNformat *Bstore;
    double   *Bmat;
    SCformat *Lstore;
    NCformat *Ustore;
    double   *Lval, *Uval;
    int      fsupc, nrow, nsupr, nsupc, irow;
    int_t    i, j, k, luptr, istart, iptr;
    int      jcol, n, ldb, nrhs;
    double   *work, *rhs_work, *soln;
    flops_t  solve_ops;
    void dprint_soln(int n, int nrhs, const double *soln);

    /* Test input parameters ... */
    *info = 0;
    Bstore = B->Store;
    ldb = Bstore->lda;
    nrhs = B->ncol;
    if ( trans != NOTRANS && trans != TRANS && trans != CONJ ) *info = -1;
    else if ( L->nrow != L->ncol || L->nrow < 0 ||
	      L->Stype != SLU_SC || L->Dtype != SLU_D || L->Mtype != SLU_TRLU )
	*info = -2;
    else if ( U->nrow != U->ncol || U->nrow < 0 ||
	      U->Stype != SLU_NC || U->Dtype != SLU_D || U->Mtype != SLU_TRU )
	*info = -3;
    else if ( ldb < SUPERLU_MAX(0, L->nrow) ||
	      B->Stype != SLU_DN || B->Dtype != SLU_D || B->Mtype != SLU_GE )
	*info = -6;
    if ( *info ) {
	int ii = -(*info);
	input_error("dgstrs", &ii);
	return;
    }

    n = L->nrow;
    work = doubleCalloc((size_t) n * (size_t) nrhs);
    if ( !work ) ABORT("Malloc fails for local work[].");
    soln = doubleMalloc((size_t) n);
    if ( !soln ) ABORT("Malloc fails for local soln[].");

    Bmat = Bstore->nzval;
    Lstore = L->Store;
    Lval = Lstore->nzval;
    Ustore = U->Store;
    Uval = Ustore->nzval;
    solve_ops = 0;
    
    if ( trans == NOTRANS ) {
	/* Permute right hand sides to form Pr*B */
	for (i = 0; i < nrhs; i++) {
	    rhs_work = &Bmat[(size_t)i * (size_t)ldb];
	    for (k = 0; k < n; k++) soln[perm_r[k]] = rhs_work[k];
	    for (k = 0; k < n; k++) rhs_work[k] = soln[k];
	}
	
	/* Forward solve PLy=Pb. */
	for (k = 0; k <= Lstore->nsuper; k++) {
	    fsupc = L_FST_SUPC(k);
	    istart = L_SUB_START(fsupc);
	    nsupr = L_SUB_START(fsupc+1) - istart;
	    nsupc = L_FST_SUPC(k+1) - fsupc;
	    nrow = nsupr - nsupc;

	    solve_ops += nsupc * (nsupc - 1) * nrhs;
	    solve_ops += 2 * nrow * nsupc * nrhs;
	    
	    if ( nsupc == 1 ) {
		for (j = 0; j < nrhs; j++) {
		    rhs_work = &Bmat[(size_t)j * (size_t)ldb];
	    	    luptr = L_NZ_START(fsupc);
		    for (iptr=istart+1; iptr < L_SUB_START(fsupc+1); iptr++){
			irow = L_SUB(iptr);
			++luptr;
			rhs_work[irow] -= rhs_work[fsupc] * Lval[luptr];
		    }
		}
	    } else {
	    	luptr = L_NZ_START(fsupc);
#ifdef USE_VENDOR_BLAS
#ifdef _CRAY
		ftcs1 = _cptofcd("L", strlen("L"));
		ftcs2 = _cptofcd("N", strlen("N"));
		ftcs3 = _cptofcd("U", strlen("U"));
		STRSM( ftcs1, ftcs1, ftcs2, ftcs3, &nsupc, &nrhs, &alpha,
		       &Lval[luptr], &nsupr, &Bmat[fsupc], &ldb);
		
		SGEMM( ftcs2, ftcs2, &nrow, &nrhs, &nsupc, &alpha, 
			&Lval[luptr+nsupc], &nsupr, &Bmat[fsupc], &ldb, 
			&beta, &work[0], &n );
#else
		dtrsm_("L", "L", "N", "U", &nsupc, &nrhs, &alpha,
		       &Lval[luptr], &nsupr, &Bmat[fsupc], &ldb);
		
		dgemm_( "N", "N", &nrow, &nrhs, &nsupc, &alpha, 
			&Lval[luptr+nsupc], &nsupr, &Bmat[fsupc], &ldb, 
			&beta, &work[0], &n );
#endif
		for (j = 0; j < nrhs; j++) {
		    rhs_work = &Bmat[(size_t)j * (size_t)ldb];
		    work_col = &work[(size_t)j * (size_t)n];
		    iptr = istart + nsupc;
		    for (i = 0; i < nrow; i++) {
			irow = L_SUB(iptr);
			rhs_work[irow] -= work_col[i]; /* Scatter */
			work_col[i] = 0.0;
			iptr++;
		    }
		}
#else		
		for (j = 0; j < nrhs; j++) {
		    rhs_work = &Bmat[(size_t)j * (size_t)ldb];
		    dlsolve (nsupr, nsupc, &Lval[luptr], &rhs_work[fsupc]);
		    dmatvec (nsupr, nrow, nsupc, &Lval[luptr+nsupc],
			    &rhs_work[fsupc], &work[0] );

		    iptr = istart + nsupc;
		    for (i = 0; i < nrow; i++) {
			irow = L_SUB(iptr);
			rhs_work[irow] -= work[i];
			work[i] = 0.0;
			iptr++;
		    }
		}
#endif		    
	    } /* else ... */
	} /* for L-solve */

#if ( DEBUGlevel>=2 )
  	printf("After L-solve: y=\n");
	dprint_soln(n, nrhs, Bmat);
#endif

	/*
	 * Back solve Ux=y.
	 */
	for (k = Lstore->nsuper; k >= 0; k--) {
	    fsupc = L_FST_SUPC(k);
	    istart = L_SUB_START(fsupc);
	    nsupr = L_SUB_START(fsupc+1) - istart;
	    nsupc = L_FST_SUPC(k+1) - fsupc;
	    luptr = L_NZ_START(fsupc);

	    solve_ops += nsupc * (nsupc + 1) * nrhs;

	    if ( nsupc == 1 ) {
		rhs_work = &Bmat[0];
		for (j = 0; j < nrhs; j++) {
		    rhs_work[fsupc] /= Lval[luptr];
		    rhs_work += ldb;
		}
	    } else {
#ifdef USE_VENDOR_BLAS
#ifdef _CRAY
		ftcs1 = _cptofcd("L", strlen("L"));
		ftcs2 = _cptofcd("U", strlen("U"));
		ftcs3 = _cptofcd("N", strlen("N"));
		STRSM( ftcs1, ftcs2, ftcs3, ftcs3, &nsupc, &nrhs, &alpha,
		       &Lval[luptr], &nsupr, &Bmat[fsupc], &ldb);
#else
		dtrsm_("L", "U", "N", "N", &nsupc, &nrhs, &alpha,
		       &Lval[luptr], &nsupr, &Bmat[fsupc], &ldb);
#endif
#else		
		for (j = 0; j < nrhs; j++)
		    dusolve ( nsupr, nsupc, &Lval[luptr], &Bmat[(size_t)fsupc + (size_t)j * (size_t)ldb] );
#endif		
	    }

	    for (j = 0; j < nrhs; ++j) {
		rhs_work = &Bmat[(size_t)j * (size_t)ldb];
		for (jcol = fsupc; jcol < fsupc + nsupc; jcol++) {
		    solve_ops += 2*(U_NZ_START(jcol+1) - U_NZ_START(jcol));
		    for (i = U_NZ_START(jcol); i < U_NZ_START(jcol+1); i++ ){
			irow = U_SUB(i);
			rhs_work[irow] -= rhs_work[jcol] * Uval[i];
		    }
		}
	    }
	    
	} /* for U-solve */

#if ( DEBUGlevel>=2 )
  	printf("After U-solve: x=\n");
	dprint_soln(n, nrhs, Bmat);
#endif

	/* Compute the final solution X := Pc*X. */
	for (i = 0; i < nrhs; i++) {
	    rhs_work = &Bmat[(size_t)i * (size_t)ldb];
	    for (k = 0; k < n; k++) soln[k] = rhs_work[perm_c[k]];
	    for (k = 0; k < n; k++) rhs_work[k] = soln[k];
	}
	
        stat->ops[SOLVE] = solve_ops;

    } else { /* Solve A'*X=B or CONJ(A)*X=B */
	/* Permute right hand sides to form Pc'*B. */
	for (i = 0; i < nrhs; i++) {
	    rhs_work = &Bmat[(size_t)i * (size_t)ldb];
	    for (k = 0; k < n; k++) soln[perm_c[k]] = rhs_work[k];
	    for (k = 0; k < n; k++) rhs_work[k] = soln[k];
	}

	stat->ops[SOLVE] = 0;
	for (k = 0; k < nrhs; ++k) {
	    
	    /* Multiply by inv(U'). */
	    sp_dtrsv("U", "T", "N", L, U, &Bmat[(size_t)k * (size_t)ldb], stat, info);
	    
	    /* Multiply by inv(L'). */
	    sp_dtrsv("L", "T", "U", L, U, &Bmat[(size_t)k * (size_t)ldb], stat, info);
	    
	}
	/* Compute the final solution X := Pr'*X (=inv(Pr)*X) */
	for (i = 0; i < nrhs; i++) {
	    rhs_work = &Bmat[(size_t)i * (size_t)ldb];
	    for (k = 0; k < n; k++) soln[k] = rhs_work[perm_r[k]];
	    for (k = 0; k < n; k++) rhs_work[k] = soln[k];
	}

    }

    SUPERLU_FREE(work);
    SUPERLU_FREE(soln);
}